

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int binstr(bstring b1,int pos,bstring b2)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  uchar *puVar5;
  
  if ((((b1 != (bstring)0x0) && (puVar5 = b1->data, puVar5 != (uchar *)0x0)) &&
      (uVar1 = b1->slen, b2 != (bstring)0x0 && -1 < (int)uVar1)) &&
     ((puVar3 = b2->data, puVar3 != (uchar *)0x0 && (iVar2 = b2->slen, -1 < iVar2)))) {
    if (uVar1 == pos) {
      return -(uint)(iVar2 != 0) | pos;
    }
    if ((uint)pos <= uVar1) {
      if (iVar2 == 0) {
        return pos;
      }
      if (pos <= (int)(uVar1 - iVar2)) {
        if (pos == 0 && puVar5 == puVar3) {
          return 0;
        }
        puVar5 = puVar5 + pos;
        while( true ) {
          lVar4 = 0;
          while (puVar3[lVar4] == puVar5[lVar4]) {
            lVar4 = lVar4 + 1;
            if (iVar2 <= (int)lVar4) {
              return pos;
            }
          }
          if ((int)(uVar1 - iVar2) <= pos) break;
          pos = pos + 1;
          puVar5 = puVar5 + 1;
        }
      }
    }
  }
  return -1;
}

Assistant:

int binstr (const bstring b1, int pos, const bstring b2) {
int j, i, l, ll;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos) return (b2->slen == 0)?pos:BSTR_ERR;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	l = b1->slen - b2->slen + 1;

	/* No space to find such a string? */
	if (l <= pos) return BSTR_ERR;

	/* An obvious alias case */
	if (b1->data == b2->data && pos == 0) return 0;

	i = pos;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	ll = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j]) {
			j ++;
			if (j >= ll) return i;
		} else {
			i ++;
			if (i >= l) break;
			j=0;
		}
	}

	return BSTR_ERR;
}